

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wav_file.cc
# Opt level: O2

void __thiscall webrtc::WavWriter::WriteSamples(WavWriter *this,int16_t *samples,size_t num_samples)

{
  size_t *psVar1;
  ulong uVar2;
  string *result;
  ostream *poVar3;
  size_t written;
  size_t num_samples_local;
  FatalMessage local_188;
  
  num_samples_local = num_samples;
  written = fwrite(samples,2,num_samples,(FILE *)this->file_handle_);
  result = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                     (&num_samples_local,&written,"num_samples == written");
  if (result != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
               ,0x97,result);
    rtc::FatalMessage::~FatalMessage(&local_188);
  }
  psVar1 = &this->num_samples_;
  uVar2 = *psVar1;
  *psVar1 = *psVar1 + written;
  if (!CARRY8(uVar2,written)) {
    return;
  }
  rtc::FatalMessage::FatalMessage
            (&local_188,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
             ,0x99);
  poVar3 = std::operator<<((ostream *)&local_188,"Check failed: num_samples_ >= written");
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<(poVar3,"# ");
  rtc::FatalMessage::~FatalMessage(&local_188);
}

Assistant:

void WavWriter::WriteSamples(const int16_t* samples, size_t num_samples) {
#ifndef WEBRTC_ARCH_LITTLE_ENDIAN
#error "Need to convert samples to little-endian when writing to WAV file"
#endif
  const size_t written =
      fwrite(samples, sizeof(*samples), num_samples, file_handle_);
  RTC_CHECK_EQ(num_samples, written);
  num_samples_ += written;
  RTC_CHECK(num_samples_ >= written);  // detect size_t overflow
}